

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

Echo * __thiscall helics::apps::Echo::operator=(Echo *this,Echo *other_echo)

{
  deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *in_RSI;
  Echo *in_RDI;
  lock_guard<std::mutex> lock;
  App *in_stack_ffffffffffffffd8;
  deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *in_stack_ffffffffffffffe8;
  
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::operator=
            (in_RSI,in_stack_ffffffffffffffe8);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_stack_ffffffffffffffd8);
  (in_RDI->delayTime).internalTimeCode =
       (baseType)
       in_RSI[3].super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
       super__Deque_impl_data._M_map;
  in_RDI->echoCounter =
       in_RSI[3].super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
       super__Deque_impl_data._M_map_size;
  App::operator=(&in_RDI->super_App,in_stack_ffffffffffffffd8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x405b47);
  return in_RDI;
}

Assistant:

Echo& Echo::operator=(Echo&& other_echo) noexcept
    {
        endpoints = std::move(other_echo.endpoints);
        std::lock_guard<std::mutex> lock(delayTimeLock);
        delayTime = other_echo.delayTime;
        echoCounter = other_echo.echoCounter;
        App::operator=(std::move(other_echo));
        return *this;
    }